

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISceneNode.h
# Opt level: O3

void __thiscall
irr::scene::ISceneNode::cloneMembers
          (ISceneNode *this,ISceneNode *toCopyFrom,ISceneManager *newManager)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  u32 uVar10;
  ISceneManager *pIVar11;
  _List_node_base *p_Var12;
  
  ::std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&this->Name,
                   (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&toCopyFrom->Name);
  fVar1 = (toCopyFrom->AbsoluteTransformation).M[0];
  fVar2 = (toCopyFrom->AbsoluteTransformation).M[1];
  fVar3 = (toCopyFrom->AbsoluteTransformation).M[2];
  fVar4 = (toCopyFrom->AbsoluteTransformation).M[3];
  uVar5 = *(undefined8 *)((toCopyFrom->AbsoluteTransformation).M + 4);
  uVar6 = *(undefined8 *)((toCopyFrom->AbsoluteTransformation).M + 6);
  uVar7 = *(undefined8 *)((toCopyFrom->AbsoluteTransformation).M + 8);
  uVar8 = *(undefined8 *)((toCopyFrom->AbsoluteTransformation).M + 10);
  uVar9 = *(undefined8 *)((toCopyFrom->AbsoluteTransformation).M + 0xe);
  *(undefined8 *)((this->AbsoluteTransformation).M + 0xc) =
       *(undefined8 *)((toCopyFrom->AbsoluteTransformation).M + 0xc);
  *(undefined8 *)((this->AbsoluteTransformation).M + 0xe) = uVar9;
  *(undefined8 *)((this->AbsoluteTransformation).M + 8) = uVar7;
  *(undefined8 *)((this->AbsoluteTransformation).M + 10) = uVar8;
  *(undefined8 *)((this->AbsoluteTransformation).M + 4) = uVar5;
  *(undefined8 *)((this->AbsoluteTransformation).M + 6) = uVar6;
  (this->AbsoluteTransformation).M[0] = fVar1;
  (this->AbsoluteTransformation).M[1] = fVar2;
  (this->AbsoluteTransformation).M[2] = fVar3;
  (this->AbsoluteTransformation).M[3] = fVar4;
  (this->RelativeTranslation).Z = (toCopyFrom->RelativeTranslation).Z;
  fVar1 = (toCopyFrom->RelativeTranslation).Y;
  (this->RelativeTranslation).X = (toCopyFrom->RelativeTranslation).X;
  (this->RelativeTranslation).Y = fVar1;
  (this->RelativeRotation).Z = (toCopyFrom->RelativeRotation).Z;
  fVar1 = (toCopyFrom->RelativeRotation).Y;
  (this->RelativeRotation).X = (toCopyFrom->RelativeRotation).X;
  (this->RelativeRotation).Y = fVar1;
  fVar1 = (toCopyFrom->RelativeScale).Y;
  (this->RelativeScale).X = (toCopyFrom->RelativeScale).X;
  (this->RelativeScale).Y = fVar1;
  (this->RelativeScale).Z = (toCopyFrom->RelativeScale).Z;
  uVar10 = toCopyFrom->AutomaticCullingState;
  this->ID = toCopyFrom->ID;
  this->AutomaticCullingState = uVar10;
  this->DebugDataVisible = toCopyFrom->DebugDataVisible;
  this->IsVisible = toCopyFrom->IsVisible;
  this->IsDebugObject = toCopyFrom->IsDebugObject;
  pIVar11 = newManager;
  if (newManager == (ISceneManager *)0x0) {
    pIVar11 = toCopyFrom->SceneManager;
  }
  this->SceneManager = pIVar11;
  for (p_Var12 = (toCopyFrom->Children).
                 super__List_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
      p_Var12 != (_List_node_base *)&toCopyFrom->Children; p_Var12 = p_Var12->_M_next) {
    (**(code **)((long)(p_Var12[1]._M_next)->_M_next + 0x110))(p_Var12[1]._M_next,this,newManager);
  }
  return;
}

Assistant:

void cloneMembers(ISceneNode *toCopyFrom, ISceneManager *newManager)
	{
		Name = toCopyFrom->Name;
		AbsoluteTransformation = toCopyFrom->AbsoluteTransformation;
		RelativeTranslation = toCopyFrom->RelativeTranslation;
		RelativeRotation = toCopyFrom->RelativeRotation;
		RelativeScale = toCopyFrom->RelativeScale;
		ID = toCopyFrom->ID;
		AutomaticCullingState = toCopyFrom->AutomaticCullingState;
		DebugDataVisible = toCopyFrom->DebugDataVisible;
		IsVisible = toCopyFrom->IsVisible;
		IsDebugObject = toCopyFrom->IsDebugObject;

		if (newManager)
			SceneManager = newManager;
		else
			SceneManager = toCopyFrom->SceneManager;

		// clone children

		ISceneNodeList::iterator it = toCopyFrom->Children.begin();
		for (; it != toCopyFrom->Children.end(); ++it)
			(*it)->clone(this, newManager);
	}